

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_1_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  int iVar22;
  float *data;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  float *pfVar30;
  int l_count;
  long lVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int scale;
  int iVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  int k_count;
  float *pfVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 in_ZMM8 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [64];
  int data_width;
  int local_a8;
  
  auVar49._8_4_ = 0x3effffff;
  auVar49._0_8_ = 0x3effffff3effffff;
  auVar49._12_4_ = 0x3effffff;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  fVar55 = ipoint->scale;
  auVar68 = ZEXT464((uint)fVar55);
  auVar41 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)fVar55),auVar48,0xf8);
  auVar41 = ZEXT416((uint)(fVar55 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  fVar54 = -0.08 / (fVar55 * fVar55);
  scale = (int)auVar41._0_4_;
  auVar42._0_4_ = (int)auVar41._0_4_;
  auVar42._4_4_ = (int)auVar41._4_4_;
  auVar42._8_4_ = (int)auVar41._8_4_;
  auVar42._12_4_ = (int)auVar41._12_4_;
  auVar41 = vcvtdq2ps_avx(auVar42);
  auVar42 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)ipoint->x),auVar48,0xf8);
  auVar42 = ZEXT416((uint)(ipoint->x + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43._0_8_ = (double)auVar42._0_4_;
  auVar43._8_8_ = auVar42._8_8_;
  auVar47._0_8_ = (double)fVar55;
  auVar47._8_8_ = 0;
  auVar42 = vfmadd231sd_fma(auVar43,auVar47,ZEXT816(0x3fe0000000000000));
  auVar46._0_4_ = (float)auVar42._0_8_;
  auVar46._4_12_ = auVar42._4_12_;
  auVar42 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)ipoint->y),auVar48,0xf8);
  fVar2 = auVar46._0_4_ - auVar41._0_4_;
  auVar42 = ZEXT416((uint)(ipoint->y + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar44._0_8_ = (double)auVar42._0_4_;
  auVar44._8_8_ = auVar42._8_8_;
  auVar42 = vfmadd231sd_fma(auVar44,auVar47,ZEXT816(0x3fe0000000000000));
  auVar45._0_4_ = (float)auVar42._0_8_;
  auVar45._4_12_ = auVar42._4_12_;
  fVar67 = auVar45._0_4_ - auVar41._0_4_;
  auVar41 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar55),auVar46);
  auVar42 = vpternlogd_avx512vl(auVar49,auVar41,auVar48,0xf8);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = ZEXT416((uint)fVar55);
  if (scale < (int)auVar41._0_4_) {
    auVar50._8_4_ = 0x3effffff;
    auVar50._0_8_ = 0x3effffff3effffff;
    auVar50._12_4_ = 0x3effffff;
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar41 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar42,auVar45);
    auVar43 = vpternlogd_avx512vl(auVar51,auVar41,auVar50,0xea);
    auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar43._0_4_));
    auVar41 = vroundss_avx(auVar41,auVar41,0xb);
    if (scale < (int)auVar41._0_4_) {
      auVar41 = vfmadd231ss_fma(auVar46,auVar42,ZEXT416(0x41300000));
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar43 = vpternlogd_avx512vl(auVar52,auVar41,auVar50,0xea);
      auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar43._0_4_));
      auVar41 = vroundss_avx(auVar41,auVar41,0xb);
      if ((int)auVar41._0_4_ + scale <= iimage->width) {
        auVar41 = vfmadd231ss_fma(auVar45,auVar42,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar43 = vpternlogd_avx512vl(auVar50,auVar41,auVar14,0xf8);
        auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar43._0_4_));
        auVar41 = vroundss_avx(auVar41,auVar41,0xb);
        if ((int)auVar41._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar30 = iimage->data;
          lVar18 = 0;
          iVar16 = -0xc;
          pfVar40 = haarResponseX;
          pfVar21 = haarResponseY;
          do {
            auVar41._0_4_ = (float)iVar16;
            auVar41._4_12_ = in_ZMM8._4_12_;
            lVar26 = 0;
            auVar41 = vfmadd213ss_fma(auVar41,auVar42,ZEXT416((uint)(fVar67 + 0.5)));
            iVar35 = (int)auVar41._0_4_;
            iVar22 = (iVar35 + -1) * iVar1;
            iVar28 = (iVar35 + -1 + scale) * iVar1;
            iVar35 = (iVar35 + -1 + scale * 2) * iVar1;
            do {
              auVar62._0_4_ = (float)((int)lVar26 + -0xc);
              auVar62._4_12_ = in_ZMM8._4_12_;
              auVar41 = vfmadd213ss_fma(auVar62,auVar42,ZEXT416((uint)(fVar2 + 0.5)));
              iVar36 = (int)auVar41._0_4_;
              iVar34 = iVar36 + -1 + scale;
              iVar32 = iVar36 + -1 + scale * 2;
              fVar55 = pfVar30[iVar35 + -1 + iVar36];
              fVar3 = pfVar30[iVar22 + iVar32];
              auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar30[iVar22 + iVar34] -
                                                      pfVar30[iVar34 + iVar35])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(pfVar30[iVar32 + iVar35] -
                                                      pfVar30[iVar22 + -1 + iVar36])));
              auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar30[iVar28 + -1 + iVar36] -
                                                      pfVar30[iVar28 + iVar32])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(pfVar30[iVar32 + iVar35] -
                                                      pfVar30[iVar22 + -1 + iVar36])));
              pfVar40[lVar26] = (fVar55 - fVar3) + auVar41._0_4_;
              pfVar21[lVar26] = auVar43._0_4_ - (fVar55 - fVar3);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0x18);
            lVar18 = lVar18 + 1;
            pfVar21 = pfVar21 + 0x18;
            pfVar40 = pfVar40 + 0x18;
            iVar16 = iVar16 + 1;
          } while (lVar18 != 0x18);
          goto LAB_00194fcb;
        }
      }
    }
  }
  iVar1 = scale * 2;
  iVar16 = -0xc;
  lVar26 = 0;
  lVar18 = 0;
  do {
    auVar56._0_4_ = (float)iVar16;
    auVar56._4_12_ = in_ZMM8._4_12_;
    auVar41 = vfmadd213ss_fma(auVar56,auVar68._0_16_,ZEXT416((uint)fVar67));
    fVar55 = auVar41._0_4_;
    lVar24 = 0;
    iVar35 = (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55);
    pfVar30 = haarResponseX;
    pfVar40 = haarResponseY;
    lVar25 = lVar26;
    do {
      auVar57._0_4_ = (float)((int)lVar24 + -0xc);
      auVar57._4_12_ = in_ZMM8._4_12_;
      auVar41 = vfmadd213ss_fma(auVar57,auVar68._0_16_,ZEXT416((uint)fVar2));
      fVar55 = auVar41._0_4_;
      iVar22 = (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55);
      if ((((iVar35 < 1) || (iVar22 < 1)) || (iimage->height < iVar1 + iVar35)) ||
         (iVar28 = iVar1 + iVar22, iimage->width < iVar28)) {
        haarXY(iimage,iVar35,iVar22,scale,(float *)((long)pfVar30 + lVar25),
               (float *)((long)pfVar40 + lVar25));
        auVar68 = ZEXT1664(auVar42);
        pfVar30 = haarResponseX;
        pfVar40 = haarResponseY;
      }
      else {
        iVar34 = iimage->data_width;
        pfVar21 = iimage->data;
        iVar32 = iVar22 + -1 + scale;
        iVar38 = iVar34 * (iVar35 + -1);
        iVar36 = iVar34 * (iVar35 + -1 + scale);
        iVar34 = iVar34 * (iVar1 + -1 + iVar35);
        fVar55 = pfVar21[iVar34 + -1 + iVar22];
        fVar3 = pfVar21[iVar38 + -1 + iVar28];
        auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar21[iVar38 + iVar32] - pfVar21[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar21[iVar34 + -1 + iVar28] -
                                                pfVar21[iVar38 + -1 + iVar22])));
        auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar21[iVar36 + -1 + iVar22] -
                                                pfVar21[iVar36 + -1 + iVar28])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar21[iVar34 + -1 + iVar28] -
                                                pfVar21[iVar38 + -1 + iVar22])));
        *(float *)((long)pfVar30 + lVar25) = (fVar55 - fVar3) + auVar41._0_4_;
        *(float *)((long)pfVar40 + lVar25) = auVar43._0_4_ - (fVar55 - fVar3);
      }
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 4;
    } while (lVar24 != 0x18);
    iVar16 = iVar16 + 1;
    lVar18 = lVar18 + 1;
    lVar26 = lVar26 + 0x60;
  } while (lVar18 != 0x18);
LAB_00194fcb:
  fVar67 = auVar68._0_4_;
  auVar66._8_4_ = 0x3effffff;
  auVar66._0_8_ = 0x3effffff3effffff;
  auVar66._12_4_ = 0x3effffff;
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar41 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 0.5)),auVar65,0xf8);
  auVar41 = ZEXT416((uint)(fVar67 * 0.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 1.5)),auVar65,0xf8);
  auVar42 = ZEXT416((uint)(fVar67 * 1.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 2.5)),auVar65,0xf8);
  auVar43 = ZEXT416((uint)(fVar67 * 2.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 3.5)),auVar65,0xf8);
  auVar44 = ZEXT416((uint)(fVar67 * 3.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 4.5)),auVar65,0xf8);
  auVar45 = ZEXT416((uint)(fVar67 * 4.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 5.5)),auVar65,0xf8);
  auVar46 = ZEXT416((uint)(fVar67 * 5.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 6.5)),auVar65,0xf8);
  auVar47 = ZEXT416((uint)(fVar67 * 6.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 7.5)),auVar65,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + fVar67 * 7.5));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 8.5)),auVar65,0xf8);
  auVar49 = ZEXT416((uint)(fVar67 * 8.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 9.5)),auVar65,0xf8);
  auVar50 = ZEXT416((uint)(fVar67 * 9.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 10.5)),auVar65,0xf8);
  auVar51 = ZEXT416((uint)(fVar67 * 10.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)(fVar67 * 11.5)),auVar65,0xf8);
  fVar59 = auVar43._0_4_;
  fVar55 = fVar59 + auVar42._0_4_;
  fVar2 = fVar59 + auVar41._0_4_;
  auVar43 = ZEXT416((uint)(fVar67 * 11.5 + auVar52._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  fVar67 = fVar59 - auVar41._0_4_;
  fVar3 = fVar59 - auVar42._0_4_;
  fVar4 = fVar59 - auVar44._0_4_;
  fVar5 = fVar59 - auVar45._0_4_;
  fVar6 = fVar59 - auVar46._0_4_;
  fVar59 = fVar59 - auVar47._0_4_;
  fVar64 = auVar48._0_4_;
  fVar7 = fVar64 - auVar44._0_4_;
  fVar8 = fVar64 - auVar45._0_4_;
  fVar9 = fVar64 - auVar46._0_4_;
  fVar10 = fVar64 - auVar47._0_4_;
  fVar11 = fVar64 - auVar49._0_4_;
  fVar12 = fVar64 - auVar50._0_4_;
  fVar13 = fVar64 - auVar51._0_4_;
  fVar64 = fVar64 - auVar43._0_4_;
  gauss_s1_c0[0] = expf(fVar55 * fVar55 * fVar54);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar54);
  gauss_s1_c0[2] = expf(fVar67 * fVar67 * fVar54);
  gauss_s1_c0[3] = expf(fVar3 * fVar3 * fVar54);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar54);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar54);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar54);
  gauss_s1_c0[8] = expf(fVar59 * fVar59 * fVar54);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar54);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar54);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar54);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar54);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar54);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar54);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar54);
  gauss_s1_c1[8] = expf(fVar64 * fVar64 * fVar54);
  auVar58._8_4_ = 0x7fffffff;
  auVar58._0_8_ = 0x7fffffff7fffffff;
  auVar58._12_4_ = 0x7fffffff;
  uVar19 = 0xfffffff8;
  fVar55 = 0.0;
  lVar18 = 0;
  lVar26 = 0;
  local_a8 = 0;
  do {
    pfVar30 = gauss_s1_c1;
    uVar17 = (uint)uVar19;
    if (uVar17 != 7) {
      pfVar30 = gauss_s1_c0;
    }
    lVar25 = (long)local_a8;
    lVar26 = (long)(int)lVar26;
    if (uVar17 == 0xfffffff8) {
      pfVar30 = gauss_s1_c1;
    }
    uVar33 = 0;
    local_a8 = local_a8 + 4;
    uVar29 = 0xfffffff8;
    lVar24 = (long)haarResponseX + lVar18;
    lVar39 = (long)haarResponseY + lVar18;
    do {
      pfVar40 = gauss_s1_c1;
      if (uVar29 != 7) {
        pfVar40 = gauss_s1_c0;
      }
      auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar29 == 0xfffffff8) {
        pfVar40 = gauss_s1_c1;
      }
      uVar20 = (ulong)(uVar29 >> 0x1c & 0xfffffff8);
      uVar23 = uVar33;
      lVar27 = lVar39;
      lVar37 = lVar24;
      do {
        lVar31 = 0;
        pfVar21 = (float *)((long)pfVar30 + (ulong)(uint)((int)(uVar19 >> 0x1f) << 5));
        do {
          fVar2 = pfVar40[uVar20] * *pfVar21;
          pfVar21 = pfVar21 + (ulong)(~uVar17 >> 0x1f) * 2 + -1;
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar27 + lVar31 * 4)),
                                  ZEXT416(*(uint *)(lVar37 + lVar31 * 4)),0x10);
          lVar31 = lVar31 + 1;
          auVar63._0_4_ = fVar2 * auVar41._0_4_;
          auVar63._4_4_ = fVar2 * auVar41._4_4_;
          auVar63._8_4_ = fVar2 * auVar41._8_4_;
          auVar63._12_4_ = fVar2 * auVar41._12_4_;
          auVar41 = vandps_avx(auVar63,auVar58);
          auVar41 = vmovlhps_avx(auVar63,auVar41);
          auVar60._0_4_ = auVar68._0_4_ + auVar41._0_4_;
          auVar60._4_4_ = auVar68._4_4_ + auVar41._4_4_;
          auVar60._8_4_ = auVar68._8_4_ + auVar41._8_4_;
          auVar60._12_4_ = auVar68._12_4_ + auVar41._12_4_;
          auVar68 = ZEXT1664(auVar60);
        } while (lVar31 != 9);
        uVar23 = uVar23 + 0x18;
        uVar20 = uVar20 + (ulong)(-1 < (int)uVar29) * 2 + -1;
        lVar37 = lVar37 + 0x60;
        lVar27 = lVar27 + 0x60;
      } while (uVar23 < uVar29 * 0x18 + 0x198);
      uVar29 = uVar29 + 5;
      uVar33 = uVar33 + 0x78;
      fVar2 = gauss_s2_arr[lVar25];
      auVar15._4_4_ = fVar2;
      auVar15._0_4_ = fVar2;
      auVar15._8_4_ = fVar2;
      auVar15._12_4_ = fVar2;
      auVar44 = vmulps_avx512vl(auVar60,auVar15);
      lVar25 = lVar25 + 1;
      auVar61._0_4_ = auVar44._0_4_ * auVar44._0_4_;
      auVar61._4_4_ = auVar44._4_4_ * auVar44._4_4_;
      auVar61._8_4_ = auVar44._8_4_ * auVar44._8_4_;
      auVar61._12_4_ = auVar44._12_4_ * auVar44._12_4_;
      auVar42 = vshufpd_avx(auVar44,auVar44,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar26) = auVar44;
      lVar26 = lVar26 + 4;
      lVar24 = lVar24 + 0x1e0;
      lVar39 = lVar39 + 0x1e0;
      auVar41 = vmovshdup_avx(auVar61);
      auVar43 = vfmadd231ss_fma(auVar41,auVar44,auVar44);
      auVar41 = vshufps_avx(auVar44,auVar44,0xff);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar43);
      auVar41 = vfmadd213ss_fma(auVar41,auVar41,auVar42);
      fVar55 = fVar55 + auVar41._0_4_;
    } while (local_a8 != (int)lVar25);
    lVar18 = lVar18 + 0x14;
    uVar19 = (ulong)(uVar17 + 5);
  } while ((int)uVar17 < 3);
  if (fVar55 < 0.0) {
    fVar55 = sqrtf(fVar55);
  }
  else {
    auVar41 = vsqrtss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
    fVar55 = auVar41._0_4_;
  }
  lVar18 = 0;
  auVar68 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar55)));
  do {
    auVar53 = vmulps_avx512f(auVar68,*(undefined1 (*) [64])(ipoint->descriptor + lVar18));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar18) = auVar53;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_1_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}